

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_obj.c
# Opt level: O1

void * lj_obj_ptr(global_State *g,cTValue *o)

{
  uint uVar1;
  
  uVar1 = (o->field_2).it;
  if (uVar1 == 0xfffffff3) {
    return (void *)((ulong)(o->u32).lo + 0x18);
  }
  if ((uVar1 & 0xffff8000) == 0xffff0000) {
    return (void *)(o->u64 & 0x7fffffffff |
                   (ulong)*(uint *)((ulong)(g->gc).lightudseg.ptr32 + (o->u64 >> 0x27 & 0xff) * 4)
                   << 0x20);
  }
  if (uVar1 == 0xfffffff5) {
    return (void *)((ulong)(o->u32).lo + 8);
  }
  if (uVar1 + 0xd < 9) {
    return (void *)(ulong)(o->u32).lo;
  }
  return (void *)0x0;
}

Assistant:

const void * LJ_FASTCALL lj_obj_ptr(global_State *g, cTValue *o)
{
  UNUSED(g);
  if (tvisudata(o))
    return uddata(udataV(o));
  else if (tvislightud(o))
    return lightudV(g, o);
  else if (LJ_HASFFI && tviscdata(o))
    return cdataptr(cdataV(o));
  else if (tvisgcv(o))
    return gcV(o);
  else
    return NULL;
}